

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall SimpleASTNode::print(SimpleASTNode *this,int level)

{
  undefined4 *puVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int iVar4;
  _List_node_base *p_Var5;
  char *local_50;
  long local_48;
  undefined4 local_40;
  undefined2 uStack_3c;
  undefined1 uStack_3a;
  undefined1 auStack_39 [3];
  undefined1 auStack_36 [6];
  
  if (level == 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  else if (0 < level) {
    iVar4 = level;
    do {
      local_50 = (char *)CONCAT71(local_50._1_7_,9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_50,1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (MULTIL_EXP < this->m_type) {
    uStack_3c = 0x6c75;
    uStack_3a = 0x74;
    local_40 = 0x61666544;
    local_48 = 7;
    puVar1 = (undefined4 *)auStack_39;
    goto LAB_00107f03;
  }
  puVar1 = (undefined4 *)((long)auStack_36 + 1);
  switch(this->m_type) {
  case DECLARATION:
    uVar3 = 0x64726f572079654b;
    break;
  case INT_LITERAL:
    local_40 = 0x20746e49;
    uStack_3c = 0x694c;
    uStack_3a = 0x74;
    auStack_39._1_2_ = 0x6172;
    auStack_36[0] = 0x6c;
    goto LAB_00107ebb;
  case ID:
    local_40 = 0x69726156;
    uStack_3c = 0x6261;
    uStack_3a = 0x6c;
    auStack_39._1_2_ = 0x4920;
    auStack_36[0] = 0x44;
LAB_00107ebb:
    auStack_39[0] = 0x65;
    local_48 = 0xb;
    goto LAB_00107f03;
  case ASSIGMENT:
    puVar1 = (undefined4 *)auStack_36;
    local_40 = 0x69737341;
    uStack_3c = 0x6e67;
    uStack_3a = 0x6d;
    auStack_39[0] = 0x65;
    auStack_39._1_2_ = 0x746e;
    local_48 = 10;
    goto LAB_00107f03;
  case ADDITIVE_EXP:
    uVar3 = 0x6576697469646441;
    break;
  case MULTIL_EXP:
    auStack_39._1_2_ = 0x6163;
    auStack_36._0_4_ = 0x65766974;
    local_40 = 0x746c754d;
    uStack_3c = 0x7069;
    uStack_3a = 0x6c;
    auStack_39[0] = 0x69;
    local_48 = 0xe;
    puVar1 = (undefined4 *)(auStack_36 + 4);
    goto LAB_00107f03;
  }
  local_40 = (undefined4)uVar3;
  uStack_3c = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_3a = (undefined1)((ulong)uVar3 >> 0x30);
  auStack_39[0] = (undefined1)((ulong)uVar3 >> 0x38);
  local_48 = 8;
  puVar1 = (undefined4 *)(auStack_39 + 1);
LAB_00107f03:
  *(undefined1 *)puVar1 = 0;
  local_50 = (char *)&local_40;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)&local_40,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->m_text)._M_dataplus._M_p,(this->m_text)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_50 != (char *)&local_40) {
    operator_delete(local_50);
  }
  p_Var5 = (this->m_childList).
           super__List_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)&this->m_childList) {
    do {
      print((SimpleASTNode *)p_Var5[1]._M_next,level + 1);
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)&this->m_childList);
  }
  return;
}

Assistant:

void SimpleASTNode::print(int level)
{
    if (!level)
        std::cout << std::endl;
    for (int i = 0; i < level; i++)
        std::cout << '\t';
    std::cout << syntaxType(m_type) << " : " << m_text << std::endl;
    for (auto& item : m_childList) {
        item->print(level + 1);
    }
}